

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::UninstallProbe(FunctionBody *this,int offset)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined4 *puVar8;
  
  if ((offset < 0) ||
     (uVar5 = ByteBlock::GetLength((this->byteCodeBlock).ptr), uVar5 <= offset + 1U)) {
    return false;
  }
  pbVar6 = ByteBlock::GetBuffer((this->byteCodeBlock).ptr);
  pbVar7 = ByteBlock::GetBuffer((this->m_sourceInfo).m_probeBackingBlock.ptr);
  OVar4 = ByteCodeReader::PeekByteOp(pbVar7 + (uint)offset);
  pbVar6[(uint)offset] = (byte)OVar4;
  pTVar1 = &(this->m_sourceInfo).m_probeCount;
  *pTVar1 = *pTVar1 + -1;
  if (-1 < *pTVar1) {
    return true;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar8 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x102c,"(m_sourceInfo.m_probeCount >= 0)",
                              "Probe (Break Point) count became negative!");
  if (bVar3) {
    *puVar8 = 0;
    return true;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

bool FunctionBody::UninstallProbe(int offset)
    {
        if (offset < 0 || ((uint)offset + 1) >= byteCodeBlock->GetLength())
        {
            return false;
        }
        byte* pbyteCodeBlockBuffer = byteCodeBlock->GetBuffer();

        Js::OpCode originalOpCode = ByteCodeReader::PeekByteOp(GetProbeBackingBlock()->GetBuffer() + offset);
        *(pbyteCodeBlockBuffer + offset) = (byte)originalOpCode;

        --m_sourceInfo.m_probeCount;
        AssertMsg(m_sourceInfo.m_probeCount >= 0, "Probe (Break Point) count became negative!");

        return true;
    }